

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setPivot(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int p_stage,int p_col,int p_row,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *val)

{
  uint *puVar1;
  pointer pnVar2;
  type_conflict5 tVar3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_01;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_1b8;
  cpp_dec_float<100U,_int,_void> local_168;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  int local_d8;
  undefined1 local_d4;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  int local_88;
  undefined1 local_84;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  int local_38;
  undefined1 local_34;
  undefined8 local_30;
  
  (this->row).orig[p_stage] = p_row;
  (this->col).orig[p_stage] = p_col;
  (this->row).perm[p_row] = p_stage;
  (this->col).perm[p_col] = p_stage;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&local_168,1.0,(type *)0x0);
  local_1b8.fpclass = cpp_dec_float_finite;
  local_1b8.prec_elem = 0x10;
  local_1b8.data._M_elems[0] = 0;
  local_1b8.data._M_elems[1] = 0;
  local_1b8.data._M_elems[2] = 0;
  local_1b8.data._M_elems[3] = 0;
  local_1b8.data._M_elems[4] = 0;
  local_1b8.data._M_elems[5] = 0;
  local_1b8.data._M_elems[6] = 0;
  local_1b8.data._M_elems[7] = 0;
  local_1b8.data._M_elems[8] = 0;
  local_1b8.data._M_elems[9] = 0;
  local_1b8.data._M_elems[10] = 0;
  local_1b8.data._M_elems[0xb] = 0;
  local_1b8.data._M_elems[0xc] = 0;
  local_1b8.data._M_elems[0xd] = 0;
  local_1b8.data._M_elems._56_5_ = 0;
  local_1b8.data._M_elems[0xf]._1_3_ = 0;
  local_1b8.exp = 0;
  local_1b8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_1b8,&local_168,&val->m_backend);
  pnVar2 = (this->diag).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (uint *)((long)pnVar2[p_row].m_backend.data._M_elems + 0x30);
  *(undefined8 *)puVar1 = local_1b8.data._M_elems._48_8_;
  *(ulong *)(puVar1 + 2) =
       CONCAT35(local_1b8.data._M_elems[0xf]._1_3_,local_1b8.data._M_elems._56_5_);
  puVar1 = (uint *)((long)pnVar2[p_row].m_backend.data._M_elems + 0x20);
  *(undefined8 *)puVar1 = local_1b8.data._M_elems._32_8_;
  *(undefined8 *)(puVar1 + 2) = local_1b8.data._M_elems._40_8_;
  puVar1 = (uint *)((long)pnVar2[p_row].m_backend.data._M_elems + 0x10);
  *(undefined8 *)puVar1 = local_1b8.data._M_elems._16_8_;
  *(undefined8 *)(puVar1 + 2) = local_1b8.data._M_elems._24_8_;
  *(undefined8 *)pnVar2[p_row].m_backend.data._M_elems = local_1b8.data._M_elems._0_8_;
  *(undefined8 *)((long)pnVar2[p_row].m_backend.data._M_elems + 8) = local_1b8.data._M_elems._8_8_;
  pnVar2[p_row].m_backend.exp = local_1b8.exp;
  pnVar2[p_row].m_backend.neg = local_1b8.neg;
  pnVar2[p_row].m_backend.fpclass = local_1b8.fpclass;
  pnVar2[p_row].m_backend.prec_elem = local_1b8.prec_elem;
  local_78 = *(undefined8 *)(val->m_backend).data._M_elems;
  uStack_70 = *(undefined8 *)((val->m_backend).data._M_elems + 2);
  local_68 = *(undefined8 *)((val->m_backend).data._M_elems + 4);
  uStack_60 = *(undefined8 *)((val->m_backend).data._M_elems + 6);
  local_58 = *(undefined8 *)((val->m_backend).data._M_elems + 8);
  uStack_50 = *(undefined8 *)((val->m_backend).data._M_elems + 10);
  local_48 = *(undefined8 *)((val->m_backend).data._M_elems + 0xc);
  uStack_40 = *(undefined8 *)((val->m_backend).data._M_elems + 0xe);
  local_38 = (val->m_backend).exp;
  local_34 = (val->m_backend).neg;
  local_30._0_4_ = (val->m_backend).fpclass;
  local_30._4_4_ = (val->m_backend).prec_elem;
  boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            ((type *)&local_1b8,(multiprecision *)&local_78,arg);
  local_168.data._M_elems._0_8_ =
       Tolerances::epsilonPivot
                 ((this->_tolerances).
                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  tVar3 = boost::multiprecision::operator<
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_1b8,(double *)&local_168);
  if (tVar3) {
    this->stat = SINGULAR;
  }
  pnVar2 = (this->diag).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_c8 = *(undefined8 *)pnVar2[p_row].m_backend.data._M_elems;
  uStack_c0 = *(undefined8 *)((long)pnVar2[p_row].m_backend.data._M_elems + 8);
  puVar1 = (uint *)((long)pnVar2[p_row].m_backend.data._M_elems + 0x10);
  local_b8 = *(undefined8 *)puVar1;
  uStack_b0 = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)pnVar2[p_row].m_backend.data._M_elems + 0x20);
  local_a8 = *(undefined8 *)puVar1;
  uStack_a0 = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)pnVar2[p_row].m_backend.data._M_elems + 0x30);
  local_98 = *(undefined8 *)puVar1;
  uStack_90 = *(undefined8 *)(puVar1 + 2);
  local_88 = pnVar2[p_row].m_backend.exp;
  local_84 = pnVar2[p_row].m_backend.neg;
  local_80._0_4_ = pnVar2[p_row].m_backend.fpclass;
  local_80._4_4_ = pnVar2[p_row].m_backend.prec_elem;
  boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            ((type *)&local_1b8,(multiprecision *)&local_c8,arg_00);
  tVar3 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_1b8,&this->maxabs);
  if (tVar3) {
    pnVar2 = (this->diag).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_118 = *(undefined8 *)pnVar2[p_row].m_backend.data._M_elems;
    uStack_110 = *(undefined8 *)((long)pnVar2[p_row].m_backend.data._M_elems + 8);
    puVar1 = (uint *)((long)pnVar2[p_row].m_backend.data._M_elems + 0x10);
    local_108 = *(undefined8 *)puVar1;
    uStack_100 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)pnVar2[p_row].m_backend.data._M_elems + 0x20);
    local_f8 = *(undefined8 *)puVar1;
    uStack_f0 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)pnVar2[p_row].m_backend.data._M_elems + 0x30);
    local_e8 = *(undefined8 *)puVar1;
    uStack_e0 = *(undefined8 *)(puVar1 + 2);
    local_d8 = pnVar2[p_row].m_backend.exp;
    local_d4 = pnVar2[p_row].m_backend.neg;
    local_d0._0_4_ = pnVar2[p_row].m_backend.fpclass;
    local_d0._4_4_ = pnVar2[p_row].m_backend.prec_elem;
    boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              ((type *)&local_1b8,(multiprecision *)&local_118,arg_01);
    *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 0xc) = local_1b8.data._M_elems._48_8_;
    *(ulong *)((this->maxabs).m_backend.data._M_elems + 0xe) =
         CONCAT35(local_1b8.data._M_elems[0xf]._1_3_,local_1b8.data._M_elems._56_5_);
    *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 8) = local_1b8.data._M_elems._32_8_;
    *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 10) = local_1b8.data._M_elems._40_8_;
    *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 4) = local_1b8.data._M_elems._16_8_;
    *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 6) = local_1b8.data._M_elems._24_8_;
    *(undefined8 *)(this->maxabs).m_backend.data._M_elems = local_1b8.data._M_elems._0_8_;
    *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 2) = local_1b8.data._M_elems._8_8_;
    (this->maxabs).m_backend.exp = local_1b8.exp;
    (this->maxabs).m_backend.neg = local_1b8.neg;
    (this->maxabs).m_backend.fpclass = local_1b8.fpclass;
    (this->maxabs).m_backend.prec_elem = local_1b8.prec_elem;
  }
  return;
}

Assistant:

void CLUFactor<R>::setPivot(const int p_stage,
                            const int p_col,
                            const int p_row,
                            const R val)
{
   assert(row.perm[p_row] < 0);
   assert(col.perm[p_col] < 0);

   row.orig[p_stage] = p_row;
   col.orig[p_stage] = p_col;
   row.perm[p_row]   = p_stage;
   col.perm[p_col]   = p_stage;
   diag[p_row]       = R(1.0) / val;

   if(spxAbs(val) < _tolerances->epsilonPivot())
   {
#ifndef NDEBUG
      SPX_MSG_ERROR(std::cerr
                    << "LU pivot element is almost zero (< "
                    << _tolerances->epsilonPivot()
                    << ") - Basis is numerically singular"
                    << std::endl;)
#endif
      this->stat = SLinSolver<R>::SINGULAR;
   }

   if(spxAbs(diag[p_row]) > maxabs)
      maxabs = spxAbs(diag[p_row]);
}